

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varinfo.c
# Opt level: O0

int varinfo_set_feature(varinfo *info,char *feature)

{
  int iVar1;
  int local_24;
  int cf;
  int data;
  char *feature_local;
  varinfo *info_local;
  
  _cf = feature;
  feature_local = (char *)info;
  iVar1 = symtab_get_t(info->data->symtab,feature,0,&local_24);
  if (iVar1 == -1) {
    fprintf(_stderr,"no feature %s\n",_cf);
    info_local._4_4_ = -1;
  }
  else {
    iVar1 = mask_intersect(*(uint32_t **)
                            (*(long *)(*(long *)feature_local + 8) + (long)local_24 * 0x40 + 0x18),
                           *(uint32_t **)(feature_local + 8),*(int *)(*(long *)feature_local + 0x10)
                          );
    if (iVar1 == -1) {
      mask_or(*(uint32_t **)(feature_local + 8),
              *(uint32_t **)(*(long *)(*(long *)feature_local + 8) + (long)local_24 * 0x40 + 0x10),
              *(int *)(*(long *)feature_local + 0x10));
      info_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"feature %s conflicts with already set feature %s\n",
              *(undefined8 *)(*(long *)(*(long *)feature_local + 8) + (long)local_24 * 0x40),
              *(undefined8 *)(*(long *)(*(long *)feature_local + 8) + (long)iVar1 * 0x40));
      info_local._4_4_ = -1;
    }
  }
  return info_local._4_4_;
}

Assistant:

int varinfo_set_feature(struct varinfo *info, const char *feature) {
	int data;
	if (symtab_get_t(info->data->symtab, feature, VARDATA_ST_FEATURE, &data) == -1) {
		fprintf(stderr, "no feature %s\n", feature);
		return -1;
	}
	int cf;
	if ((cf = mask_intersect(info->data->features[data].cfmask, info->fmask, info->data->featuresnum)) != -1) {
		fprintf(stderr, "feature %s conflicts with already set feature %s\n", info->data->features[data].name, info->data->features[cf].name);
		return -1;
	}
	mask_or(info->fmask, info->data->features[data].ifmask, info->data->featuresnum);
	return 0;
}